

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O3

UniValue * NormalizeOutputs(UniValue *__return_storage_ptr__,UniValue *outputs_in)

{
  pointer pcVar1;
  UniValue obj;
  VType VVar2;
  UniValue *pUVar3;
  size_t index;
  long in_FS_OFFSET;
  UniValue outputs_dict;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffed4;
  undefined1 *puVar5;
  undefined8 in_stack_fffffffffffffee0;
  long in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffef0 [48];
  undefined1 local_d8 [40];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [9];
  undefined4 local_97;
  undefined2 local_93;
  char local_91;
  undefined1 local_90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<UniValue,_std::allocator<UniValue>_> vStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  VVar2 = outputs_in->typ;
  if (VVar2 == VNULL) {
    pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
    local_90._0_8_ = local_90 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Invalid parameter, output argument must be non-null","");
    JSONRPCError(pUVar3,-8,(string *)local_90);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    if (VVar2 == VOBJ) {
      pUVar3 = UniValue::get_obj(outputs_in);
    }
    else {
      pUVar3 = UniValue::get_array(outputs_in);
    }
    __return_storage_ptr__->typ = pUVar3->typ;
    this = &__return_storage_ptr__->val;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    pcVar1 = (pUVar3->val)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this,pcVar1,pcVar1 + (pUVar3->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->keys,&pUVar3->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector
              (&__return_storage_ptr__->values,&pUVar3->values);
    if (VVar2 != VOBJ) {
      local_b0 = local_a0;
      local_90._8_8_ = &local_78;
      local_90._0_4_ = 1;
      local_78._M_local_buf[0] = '\0';
      local_78._1_7_ = (undefined7)local_a0._1_8_;
      local_78._M_local_buf[8] = SUB81(local_a0._1_8_,7);
      local_78._9_4_ = local_97;
      local_78._13_2_ = local_93;
      local_78._M_local_buf[0xf] = local_91;
      local_90._16_8_ = 0;
      local_a8 = 0;
      local_a0[0] = 0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      VVar2 = VOBJ;
      if ((__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        index = 0;
        do {
          pUVar3 = UniValue::operator[](__return_storage_ptr__,index);
          if (pUVar3->typ != VOBJ) {
            pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
            local_d8._0_8_ = local_d8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,
                       "Invalid parameter, key-value pair not an object as expected","");
            JSONRPCError(pUVar3,-8,(string *)local_d8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_006b4e58;
          }
          if ((long)(pUVar3->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(pUVar3->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_start != 0x58) {
            pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
            local_d8._0_8_ = local_d8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,
                       "Invalid parameter, key-value pair must contain exactly one key","");
            JSONRPCError(pUVar3,-8,(string *)local_d8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_006b4e58;
          }
          uVar4 = 1;
          pcVar1 = (pUVar3->val)._M_dataplus._M_p;
          puVar5 = &stack0xfffffffffffffee8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&stack0xfffffffffffffed8,pcVar1,
                     pcVar1 + (pUVar3->val)._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffef8,&pUVar3->keys);
          std::vector<UniValue,_std::allocator<UniValue>_>::vector
                    ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff10,
                     &pUVar3->values);
          obj.val._M_dataplus._M_p._0_4_ = uVar4;
          obj._0_8_ = this;
          obj.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffed4;
          obj.val._M_string_length = (size_type)puVar5;
          obj.val.field_2._M_allocated_capacity = in_stack_fffffffffffffee0;
          obj.val.field_2._8_8_ = in_stack_fffffffffffffee8;
          obj.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data =
               (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )in_stack_fffffffffffffef0._0_24_;
          obj.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data =
               (_Vector_base<UniValue,_std::allocator<UniValue>_>)
               (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffef0._24_24_;
          UniValue::pushKVs((UniValue *)local_90,obj);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                    ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff10);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xfffffffffffffef8);
          if (puVar5 != &stack0xfffffffffffffee8) {
            operator_delete(puVar5,in_stack_fffffffffffffee8 + 1);
          }
          index = index + 1;
        } while (index < (ulong)(((long)(__return_storage_ptr__->values).
                                        super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(__return_storage_ptr__->values).
                                        super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x2e8ba2e8ba2e8ba3));
        VVar2 = local_90._0_4_;
      }
      __return_storage_ptr__->typ = VVar2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_90 + 8));
      local_d8._16_8_ =
           (__return_storage_ptr__->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_d8._0_8_ =
           (__return_storage_ptr__->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_d8._8_8_ =
           (__return_storage_ptr__->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8);
      local_d8._16_8_ =
           (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_d8._0_8_ =
           (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_d8._8_8_ =
           (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_start =
           vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)local_d8);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._8_8_ != &local_78) {
        operator_delete((void *)local_90._8_8_,CONCAT71(local_78._1_7_,local_78._M_local_buf[0]) + 1
                       );
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
LAB_006b4e58:
  __stack_chk_fail();
}

Assistant:

UniValue NormalizeOutputs(const UniValue& outputs_in)
{
    if (outputs_in.isNull()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, output argument must be non-null");
    }

    const bool outputs_is_obj = outputs_in.isObject();
    UniValue outputs = outputs_is_obj ? outputs_in.get_obj() : outputs_in.get_array();

    if (!outputs_is_obj) {
        // Translate array of key-value pairs into dict
        UniValue outputs_dict = UniValue(UniValue::VOBJ);
        for (size_t i = 0; i < outputs.size(); ++i) {
            const UniValue& output = outputs[i];
            if (!output.isObject()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, key-value pair not an object as expected");
            }
            if (output.size() != 1) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, key-value pair must contain exactly one key");
            }
            outputs_dict.pushKVs(output);
        }
        outputs = std::move(outputs_dict);
    }
    return outputs;
}